

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O2

void __thiscall cppnet::BlockMemoryPool::Expansion(BlockMemoryPool *this,uint32_t num)

{
  void *in_RAX;
  bool bVar1;
  void *mem;
  void *local_28;
  
  if (num == 0) {
    num = this->_number_large_add_nodes;
  }
  local_28 = in_RAX;
  while (bVar1 = num != 0, num = num - 1, bVar1) {
    local_28 = malloc((ulong)this->_large_size);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->_free_mem_vec,&local_28);
  }
  return;
}

Assistant:

void BlockMemoryPool::Expansion(uint32_t num) {
    if (num == 0) {
        num = _number_large_add_nodes;
    }

    for (uint32_t i = 0; i < num; ++i) {
        void* mem = malloc(_large_size);
        // not memset!
        _free_mem_vec.push_back(mem);
    }
}